

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dino_template_generator.c
# Opt level: O2

_Bool pi_template_if_set(pi_template_generator_t *ptg_context)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = ptg_context->if_stack_top;
  uVar3 = 0;
  uVar2 = 0;
  if (0 < (int)uVar1) {
    uVar3 = (ulong)uVar1;
  }
  do {
    uVar4 = uVar2;
    if (uVar3 == uVar4) break;
    uVar2 = uVar4 + 1;
  } while (ptg_context->if_stack[uVar4] != false);
  return (long)(int)uVar1 <= (long)uVar4;
}

Assistant:

bool pi_template_if_set(pi_template_generator_t *ptg_context) {
    for (int i = 0; i < ptg_context->if_stack_top; i++) {
        if (!ptg_context->if_stack[i]) {
            return false;
        }
    }
    return true;
}